

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_binding.hpp
# Opt level: O2

any * __thiscall
shadow::conversion_detail::generic_conversion_bind_point<long_double,char>
          (any *__return_storage_ptr__,conversion_detail *this,any *src)

{
  conversion_specializer<long_double,_char,_void>::dispatch(__return_storage_ptr__,(any *)this);
  return __return_storage_ptr__;
}

Assistant:

any
generic_conversion_bind_point(const any& src)
{
    return conversion_specializer<TargetType, SourceType>::dispatch(src);
}